

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O3

void __thiscall icu_63::double_conversion::Bignum::SubtractBignum(Bignum *this,Bignum *other)

{
  uint *puVar1;
  bool bVar2;
  long lVar3;
  uint *puVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  
  Align(this,other);
  if (0 < other->used_digits_) {
    puVar4 = (this->bigits_).start_;
    puVar1 = (other->bigits_).start_;
    lVar3 = (long)other->exponent_ * 4 + (long)this->exponent_ * -4;
    lVar6 = 0;
    iVar7 = 0;
    do {
      uVar8 = (iVar7 + *(int *)((long)puVar4 + lVar3)) - puVar1[lVar6];
      *(uint *)((long)puVar4 + lVar3) = uVar8 & 0xfffffff;
      iVar7 = (int)uVar8 >> 0x1f;
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar6 < other->used_digits_);
    if ((int)uVar8 < 0) {
      puVar4 = (uint *)(lVar3 + (long)(this->bigits_).start_);
      do {
        uVar8 = *puVar4;
        *puVar4 = uVar8 - 1 & 0xfffffff;
        puVar4 = puVar4 + 1;
      } while ((int)(uVar8 - 1) < 0);
    }
  }
  iVar7 = this->used_digits_;
  if ((long)iVar7 < 1) {
    if (iVar7 != 0) {
      return;
    }
  }
  else {
    puVar4 = (this->bigits_).start_;
    uVar5 = (long)iVar7;
    do {
      if (puVar4[uVar5 - 1] != 0) {
        return;
      }
      this->used_digits_ = (int)uVar5 + -1;
      bVar2 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar2);
  }
  this->exponent_ = 0;
  return;
}

Assistant:

void Bignum::SubtractBignum(const Bignum& other) {
  ASSERT(IsClamped());
  ASSERT(other.IsClamped());
  // We require this to be bigger than other.
  ASSERT(LessEqual(other, *this));

  Align(other);

  int offset = other.exponent_ - exponent_;
  Chunk borrow = 0;
  int i;
  for (i = 0; i < other.used_digits_; ++i) {
    ASSERT((borrow == 0) || (borrow == 1));
    Chunk difference = bigits_[i + offset] - other.bigits_[i] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  while (borrow != 0) {
    Chunk difference = bigits_[i + offset] - borrow;
    bigits_[i + offset] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
    ++i;
  }
  Clamp();
}